

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O2

uint Extra_TruthCanonNP(uint uTruth,int nVars)

{
  byte bVar1;
  uint Truth;
  uint uVar2;
  long lVar3;
  int iVar4;
  int Polarity;
  uint uVar5;
  
  if (Extra_TruthCanonNP::pPerms != (char **)0x0) {
    if (Extra_TruthCanonNP::nVarsOld == nVars) goto LAB_00389391;
    free(Extra_TruthCanonNP::pPerms);
    Extra_TruthCanonNP::pPerms = (char **)0x0;
  }
  Extra_TruthCanonNP::nPerms = Extra_Factorial(nVars);
  Extra_TruthCanonNP::pPerms = Extra_Permutations(nVars);
  Extra_TruthCanonNP::nVarsOld = nVars;
LAB_00389391:
  bVar1 = (byte)nVars & 0x1f;
  Polarity = 0;
  iVar4 = 1 << bVar1;
  if (1 << bVar1 < 1) {
    iVar4 = 0;
  }
  uVar5 = 0xffffffff;
  for (; Polarity != iVar4; Polarity = Polarity + 1) {
    Truth = Extra_TruthPolarize(uTruth,Polarity,nVars);
    for (lVar3 = 0; lVar3 < Extra_TruthCanonNP::nPerms; lVar3 = lVar3 + 1) {
      uVar2 = Extra_TruthPermute(Truth,Extra_TruthCanonNP::pPerms[lVar3],nVars,0);
      if (uVar2 <= uVar5) {
        uVar5 = uVar2;
      }
    }
  }
  return uVar5;
}

Assistant:

unsigned Extra_TruthCanonNP( unsigned uTruth, int nVars )
{
    static int nVarsOld, nPerms;
    static char ** pPerms = NULL;

    unsigned uTruthMin, uPhase, uPerm;
    int nMints, k, i;

    if ( pPerms == NULL )
    {
        nPerms = Extra_Factorial( nVars );   
        pPerms = Extra_Permutations( nVars );
        nVarsOld = nVars;
    }
    else if ( nVarsOld != nVars )
    {
        ABC_FREE( pPerms );
        nPerms = Extra_Factorial( nVars );   
        pPerms = Extra_Permutations( nVars );
        nVarsOld = nVars;
    }

    nMints    = (1 << nVars);
    uTruthMin = 0xFFFFFFFF;
    for ( i = 0; i < nMints; i++ )
    {
        uPhase = Extra_TruthPolarize( uTruth, i, nVars ); 
        for ( k = 0; k < nPerms; k++ )
        {
            uPerm = Extra_TruthPermute( uPhase, pPerms[k], nVars, 0 );
            if ( uTruthMin > uPerm )
                uTruthMin = uPerm;
        }
    }
    return uTruthMin;
}